

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QGraphicsSceneBspTree::Node>::relocate
          (QArrayDataPointer<QGraphicsSceneBspTree::Node> *this,qsizetype offset,Node **data)

{
  Node *d_first;
  Node *pNVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QGraphicsSceneBspTree::Node,long_long>
            (this->ptr,this->size,d_first);
  if (data != (Node **)0x0) {
    pNVar1 = *data;
    if ((this->ptr <= pNVar1) && (pNVar1 < this->ptr + this->size)) {
      *data = pNVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }